

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_sort(HSQUIRRELVM v)

{
  bool bVar1;
  SQInteger SVar2;
  HSQUIRRELVM in_RDI;
  SQObjectPtr *unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  SQObjectPtr *o;
  SQInteger func;
  SQInteger in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQInteger func_00;
  HSQUIRRELVM r;
  SQInteger in_stack_fffffffffffffff8;
  
  func_00 = -1;
  stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SVar2 = SQArray::Size((SQArray *)0x11f114);
  if (1 < SVar2) {
    in_stack_ffffffffffffffd0 = in_RDI;
    SVar2 = sq_gettop(in_RDI);
    if (SVar2 == 2) {
      func_00 = 2;
    }
    r = in_stack_ffffffffffffffd0;
    SQArray::Size((SQArray *)0x11f155);
    bVar1 = _hsort(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,(SQInteger)r,func_00);
    if (!bVar1) {
      return -1;
    }
  }
  sq_settop(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return 1;
}

Assistant:

static SQInteger array_sort(HSQUIRRELVM v)
{
    SQInteger func = -1;
    SQObjectPtr &o = stack_get(v,1);
    if(_array(o)->Size() > 1) {
        if(sq_gettop(v) == 2) func = 2;
        if(!_hsort(v, o, 0, _array(o)->Size()-1, func))
            return SQ_ERROR;

    }
    sq_settop(v,1);
    return 1;
}